

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::setInterfaceTag
          (CommonCore *this,InterfaceHandle handle,string_view tag,string_view value)

{
  shared_mutex *__rwlock;
  int iVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  _Alloc_hider _Var3;
  BasicHandleInfo *this_00;
  InvalidIdentifier *this_01;
  pointer_____offset_0x10___ *ppuVar4;
  size_type sVar5;
  string_view message;
  string_view message_00;
  string_view value_00;
  ActionMessage tagcmd;
  undefined1 local_e8 [16];
  pointer local_d8;
  
  if (setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
      ::trueString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                                 ::trueString_abi_cxx11_);
    if (iVar1 != 0) {
      setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
      ::trueString_abi_cxx11_._M_dataplus._M_p =
           (pointer)&setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                     ::trueString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                  ::trueString_abi_cxx11_,"true","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                    ::trueString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                           ::trueString_abi_cxx11_);
    }
  }
  if (tag._M_len == 0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "tag cannot be an empty string for setInterfaceTag";
    message._M_len = 0x31;
    InvalidParameter::InvalidParameter((InvalidParameter *)this_01,message);
    ppuVar4 = &InvalidParameter::typeinfo;
  }
  else {
    ppVar2 = getHandleInfo(this,handle);
    if (ppVar2 != (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x0) {
      _Var3._M_p = value._M_str;
      sVar5 = value._M_len;
      if (value._M_len == 0) {
        _Var3 = setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                ::trueString_abi_cxx11_._M_dataplus;
        sVar5 = setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                ::trueString_abi_cxx11_._M_string_length;
      }
      __rwlock = &(this->handles).m_mutex;
      iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
      if (iVar1 != 0x23) {
        this_00 = HandleManager::getHandleInfo(&(this->handles).m_obj,handle.hid);
        value_00._M_str = _Var3._M_p;
        value_00._M_len = sVar5;
        BasicHandleInfo::setTag(this_00,tag,value_00);
        pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_interface_tag);
        local_e8._8_8_ = (ppVar2->first)._M_dataplus._M_p;
        local_d8 = (ppVar2->first)._M_dataplus._M_p;
        ActionMessage::setStringData((ActionMessage *)local_e8,tag,value);
        BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e8);
        ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        return;
      }
      std::__throw_system_error(0x23);
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message_00._M_str = "the handle specifier for setInterfaceTag is not valid";
    message_00._M_len = 0x35;
    InvalidIdentifier::InvalidIdentifier(this_01,message_00);
    ppuVar4 = &InvalidIdentifier::typeinfo;
  }
  __cxa_throw(this_01,ppuVar4,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setInterfaceTag(helics::InterfaceHandle handle,
                                 std::string_view tag,
                                 std::string_view value)
{
    static const std::string trueString{"true"};
    if (tag.empty()) {
        throw InvalidParameter("tag cannot be an empty string for setInterfaceTag");
    }
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw InvalidIdentifier("the handle specifier for setInterfaceTag is not valid");
        return;
    }

    std::string_view valueStr{value.empty() ? trueString : value};

    handles.modify(
        [&](auto& hdls) { hdls.getHandleInfo(handle.baseValue())->setTag(tag, valueStr); });

    if (handleInfo != nullptr) {
        ActionMessage tagcmd(CMD_INTERFACE_TAG);
        tagcmd.setSource(handleInfo->handle);
        tagcmd.setDestination(handleInfo->handle);
        tagcmd.setStringData(tag, value);
        addActionMessage(std::move(tagcmd));
    }
}